

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

double ** covarianceMatrix(double **x,double *x_mu,double **y,double *y_mu,int start,int end,int n)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  int m;
  double **x_00;
  double **y_00;
  double **x_01;
  double **ppdVar5;
  double **ncl;
  ulong nch;
  int iVar6;
  long nrh;
  double **ppdVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  
  iVar8 = end - start;
  m = iVar8 + 1;
  nrh = (long)m;
  uVar10 = 1;
  x_00 = matrix(1,nrh,1,3);
  y_00 = matrix(1,nrh,1,3);
  nch = (ulong)(uint)n;
  if (-1 < iVar8) {
    do {
      if (0 < n) {
        iVar6 = start + -1 + (int)uVar10;
        pdVar1 = y[iVar6];
        pdVar2 = x_00[uVar10];
        pdVar3 = x[iVar6];
        pdVar4 = y_00[uVar10];
        lVar9 = 0;
        do {
          *(double *)((long)pdVar2 + lVar9 + 8) =
               *(double *)((long)pdVar1 + lVar9 + 8) - *(double *)((long)y_mu + lVar9 + 8);
          *(double *)((long)pdVar4 + lVar9 + 8) =
               *(double *)((long)pdVar3 + lVar9 + 8) - *(double *)((long)x_mu + lVar9 + 8);
          lVar9 = lVar9 + 8;
        } while ((ulong)(n + 1) * 8 + -8 != lVar9);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != iVar8 + 2);
  }
  x_01 = transpose_matrix(x_00,m,n);
  ncl = y_00;
  ppdVar5 = multiply_matrix(x_01,n,m,y_00,m,n);
  if (0 < n) {
    ncl = (double **)0x1;
    do {
      pdVar1 = ppdVar5[(long)ncl];
      ppdVar7 = (double **)0x1;
      do {
        pdVar1[(long)ppdVar7] = pdVar1[(long)ppdVar7] / (double)iVar8;
        ppdVar7 = (double **)((long)ppdVar7 + 1);
      } while ((double **)(ulong)(n + 1) != ppdVar7);
      ncl = (double **)((long)ncl + 1);
    } while (ncl != (double **)(ulong)(n + 1));
  }
  free_matrix(y_00,1,nrh,(long)ncl,nch);
  free_matrix(x_00,1,nrh,(long)ncl,nch);
  free_matrix(x_01,1,(long)n,(long)ncl,nch);
  return ppdVar5;
}

Assistant:

double **covarianceMatrix(double **x, double *x_mu, double **y, double *y_mu, int start, int end, int n) {
    int k, l;
    double **tmp;
    double **tmpx;
    double **tmpy;
    double **tmpyT;

    int m = end - start + 1;

    tmpy = matrix(1, m, 1, NP);
    tmpx = matrix(1, m, 1, NP);
    /* precompute the mean matrix of x and y for speed */
    for (k = 1; k <= m; k++) {
        for (l = 1; l <= n; l++) {
            tmpy[k][l] = y[k + start - 1][l] - y_mu[l];  //printf("TMP Y\n");  print_matrix(tmpy,3,3);
            tmpx[k][l] = x[k + start - 1][l] - x_mu[l];  //printf("TMP X\n");  print_matrix(tmpx,3,3);
        }
    }
    tmpyT = transpose_matrix(tmpy, m, n);
    tmp = multiply_matrix(tmpyT, n, m, tmpx, m, n);
    for (k = 1; k <= n; k++) {
        for (l = 1; l <= n; l++)
            tmp[k][l] /= m - 1;  // Why m-1????
    }

    /* cleanup */
    free_matrix(tmpx, 1, m, 1, NP);
    free_matrix(tmpy, 1, m, 1, NP);
    free_matrix(tmpyT, 1, n, 1, m);
    //    if (DEBUG)  printf("\t\tcovariance_matrix()::Covariance Matrix\n"); print_matrix(tmp,3,3);

    return tmp;
}